

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfsubs.cpp
# Opt level: O0

void __thiscall
icu_63::FractionalPartSubstitution::FractionalPartSubstitution
          (FractionalPartSubstitution *this,int32_t _pos,NFRuleSet *_ruleSet,
          UnicodeString *description,UErrorCode *status)

{
  UErrorCode *pUVar1;
  UnicodeString *pUVar2;
  int8_t iVar3;
  NFRuleSet *pNVar4;
  bool bVar5;
  ConstChar16Ptr local_60;
  byte local_51;
  ConstChar16Ptr local_50 [3];
  ConstChar16Ptr local_38;
  UErrorCode *local_30;
  UErrorCode *status_local;
  UnicodeString *description_local;
  NFRuleSet *_ruleSet_local;
  FractionalPartSubstitution *pFStack_10;
  int32_t _pos_local;
  FractionalPartSubstitution *this_local;
  
  local_30 = status;
  status_local = (UErrorCode *)description;
  description_local = (UnicodeString *)_ruleSet;
  _ruleSet_local._4_4_ = _pos;
  pFStack_10 = this;
  NFSubstitution::NFSubstitution(&this->super_NFSubstitution,_pos,_ruleSet,description,status);
  pUVar1 = status_local;
  (this->super_NFSubstitution).super_UObject._vptr_UObject =
       (_func_int **)&PTR__FractionalPartSubstitution_0049f1e8;
  this->byDigits = '\0';
  this->useSpaces = '\x01';
  local_51 = 0;
  ConstChar16Ptr::ConstChar16Ptr(&local_38,L">>");
  iVar3 = UnicodeString::compare((UnicodeString *)pUVar1,&local_38,2);
  pUVar1 = status_local;
  bVar5 = true;
  if (iVar3 != '\0') {
    ConstChar16Ptr::ConstChar16Ptr(local_50,L">>>");
    local_51 = 1;
    iVar3 = UnicodeString::compare((UnicodeString *)pUVar1,local_50,3);
    pUVar2 = description_local;
    bVar5 = true;
    if (iVar3 != '\0') {
      pNVar4 = NFSubstitution::getRuleSet(&this->super_NFSubstitution);
      bVar5 = (NFRuleSet *)pUVar2 == pNVar4;
    }
  }
  if ((local_51 & 1) != 0) {
    ConstChar16Ptr::~ConstChar16Ptr(local_50);
  }
  ConstChar16Ptr::~ConstChar16Ptr(&local_38);
  pUVar1 = status_local;
  if (bVar5) {
    this->byDigits = '\x01';
    ConstChar16Ptr::ConstChar16Ptr(&local_60,L">>>");
    iVar3 = UnicodeString::compare((UnicodeString *)pUVar1,&local_60,3);
    ConstChar16Ptr::~ConstChar16Ptr(&local_60);
    if (iVar3 == '\0') {
      this->useSpaces = '\0';
    }
  }
  else {
    pNVar4 = NFSubstitution::getRuleSet(&this->super_NFSubstitution);
    NFRuleSet::makeIntoFractionRuleSet(pNVar4);
  }
  return;
}

Assistant:

FractionalPartSubstitution::FractionalPartSubstitution(int32_t _pos,
                             const NFRuleSet* _ruleSet,
                             const UnicodeString& description,
                             UErrorCode& status)
 : NFSubstitution(_pos, _ruleSet, description, status)
 , byDigits(FALSE)
 , useSpaces(TRUE)

{
    // akk, ruleSet can change in superclass constructor
    if (0 == description.compare(gGreaterGreaterThan, 2) ||
        0 == description.compare(gGreaterGreaterGreaterThan, 3) ||
        _ruleSet == getRuleSet()) {
        byDigits = TRUE;
        if (0 == description.compare(gGreaterGreaterGreaterThan, 3)) {
            useSpaces = FALSE;
        }
    } else {
        // cast away const
        ((NFRuleSet*)getRuleSet())->makeIntoFractionRuleSet();
    }
}